

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaWriteVer.c
# Opt level: O2

char * Prs_ObjGetName(Prs_Ntk_t *p,int NameId)

{
  byte bVar1;
  byte *pbVar2;
  Vec_Str_t *p_00;
  char *pcVar3;
  byte *pbVar4;
  
  pbVar2 = (byte *)Prs_NtkStr(p,NameId);
  if (pbVar2 == (byte *)0x0) {
    pbVar2 = (byte *)0x0;
  }
  else {
    bVar1 = *pbVar2;
    if (bVar1 != 0x5c) {
      if (bVar1 == 0) {
        __assert_fail("pName != NULL && *pName != \'\\0\'",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaWriteVer.c"
                      ,0x8b,"int Prs_NameIsLegalInVerilog(char *, int)");
      }
      if ((0xc < NameId) &&
         ((pbVar4 = pbVar2, 0xe5 < (byte)(bVar1 + 0x85) ||
          (bVar1 == 0x5f || (byte)(bVar1 + 0xbf) < 0x1a)))) {
        do {
          pbVar4 = pbVar4 + 1;
          bVar1 = *pbVar4;
          if (bVar1 == 0) {
            return (char *)pbVar2;
          }
        } while ((((0xf5 < (byte)(bVar1 - 0x3a)) || (0xe5 < (byte)((bVar1 & 0xdf) + 0xa5))) ||
                 (bVar1 == 0x5f)) || (bVar1 == 0x24));
      }
      p_00 = Abc_NamBuffer(p->pStrs);
      pcVar3 = Vec_StrPrintF(p_00,"\\%s ",pbVar2);
      return pcVar3;
    }
  }
  return (char *)pbVar2;
}

Assistant:

char * Prs_ObjGetName( Prs_Ntk_t * p, int NameId )
{
    char * pName = Prs_NtkStr(p, NameId);
    if ( pName == NULL )
        return pName;
    if ( Prs_NameIsLegalInVerilog(pName, NameId) )
        return pName;
    return Vec_StrPrintF( Abc_NamBuffer(p->pStrs), "\\%s ", pName );
}